

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::JUnitReporter::test_case_end
          (JUnitReporter *this,CurrentTestCaseStats *param_1)

{
  double time;
  vector<doctest::String,_std::allocator<doctest::String>_> local_30;
  CurrentTestCaseStats *local_18;
  CurrentTestCaseStats *param_1_local;
  JUnitReporter *this_local;
  
  local_18 = param_1;
  param_1_local = (CurrentTestCaseStats *)this;
  time = detail::Timer::getElapsedSeconds(&this->timer);
  JUnitTestCaseData::addTime(&this->testCaseData,time);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
            (&local_30,&this->deepestSubcaseStackNames);
  JUnitTestCaseData::appendSubcaseNamesToLastTestcase(&this->testCaseData,&local_30);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector(&local_30);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::clear
            (&this->deepestSubcaseStackNames);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats&) override {
            testCaseData.addTime(timer.getElapsedSeconds());
            testCaseData.appendSubcaseNamesToLastTestcase(deepestSubcaseStackNames);
            deepestSubcaseStackNames.clear();
        }